

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsScissorTests.cpp
# Opt level: O1

void __thiscall
deqp::gls::Functional::anon_unknown_0::ScissorPrimitiveCase::render
          (ScissorPrimitiveCase *this,GLuint program,IVec4 *param_2)

{
  float fVar1;
  float fVar2;
  DataType DVar3;
  undefined *puVar4;
  glUniform4fvFunc p_Var5;
  Functions *gl;
  int iVar6;
  GLint GVar7;
  undefined4 extraout_var;
  int iVar8;
  int iVar9;
  long lVar10;
  int iVar11;
  ulong uVar12;
  DataType DVar13;
  int iVar14;
  float fVar15;
  float fVar16;
  vector<unsigned_short,_std::allocator<unsigned_short>_> indices;
  vector<float,_std::allocator<float>_> positions;
  Random rng;
  Vec4 white;
  int local_cc;
  float local_b0;
  float local_ac;
  vector<unsigned_short,_std::allocator<unsigned_short>_> local_88;
  vector<float,_std::allocator<float>_> local_70;
  Functions *local_58;
  deRandom local_50;
  undefined1 *local_40;
  undefined1 *puStack_38;
  
  iVar6 = (*((this->super_ScissorCase).m_renderCtx)->_vptr_RenderContext[3])();
  local_58 = (Functions *)CONCAT44(extraout_var,iVar6);
  local_40 = &DAT_3f8000003f800000;
  puStack_38 = &DAT_3f8000003f800000;
  fVar16 = (this->m_renderArea).m_data[0];
  fVar1 = (this->m_renderArea).m_data[2];
  fVar2 = (this->m_renderArea).m_data[3];
  uVar12 = (ulong)this->m_primitiveType;
  puVar4 = (&PTR_pointPosition_021c1f50)[uVar12];
  DVar3 = deqp::gles2::Performance::ShaderOperatorTests::init()::floatTypes[uVar12];
  iVar6 = *(int *)(&DAT_01cef250 + uVar12 * 4);
  fVar15 = (float)this->m_primitiveCount + (float)this->m_primitiveCount;
  if (fVar15 < 0.0) {
    fVar15 = sqrtf(fVar15);
  }
  else {
    fVar15 = SQRT(fVar15);
  }
  std::vector<float,_std::allocator<float>_>::vector
            (&local_70,(long)(int)(this->m_primitiveCount * DVar3 * 4),(allocator_type *)&local_88);
  std::vector<unsigned_short,_std::allocator<unsigned_short>_>::vector
            (&local_88,(long)(this->m_primitiveCount * iVar6),(allocator_type *)&local_50);
  deRandom_init(&local_50,0x4d2);
  iVar8 = this->m_primitiveCount;
  if (0 < iVar8) {
    fVar16 = fVar16 + fVar16 + -1.0;
    DVar13 = TYPE_FLOAT;
    if (1 < (int)DVar3) {
      DVar13 = DVar3;
    }
    iVar11 = 1;
    if (1 < iVar6) {
      iVar11 = iVar6;
    }
    local_cc = 3;
    iVar9 = 0;
    iVar14 = 0;
    do {
      local_b0 = 0.0;
      local_ac = 0.0;
      if (1 < iVar8) {
        local_ac = deRandom_getFloat(&local_50);
      }
      if (1 < this->m_primitiveCount) {
        local_b0 = deRandom_getFloat(&local_50);
      }
      lVar10 = 0;
      uVar12 = 0;
      iVar8 = local_cc;
      do {
        local_70.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
        _M_start[iVar8 + -3] =
             (*(float *)(puVar4 + (lVar10 >> 0x1e)) * (1.44 / fVar15) + local_ac) * (fVar1 + fVar1)
             + fVar16;
        local_70.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
        _M_start[iVar8 + -2] =
             (*(float *)(puVar4 + (long)((int)uVar12 + 1) * 4) * (1.44 / fVar15) + local_b0) *
             (fVar2 + fVar2) + fVar16;
        local_70.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
        _M_start[iVar8 + -1] = 0.2;
        local_70.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
        _M_start[iVar8] = 1.0;
        uVar12 = uVar12 + 2;
        lVar10 = lVar10 + 0x200000000;
        iVar8 = iVar8 + 4;
      } while (DVar13 * 2 != uVar12);
      uVar12 = 0;
      iVar8 = iVar9;
      do {
        local_88.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
        super__Vector_impl_data._M_start[iVar8] =
             *(short *)((long)&DAT_01cef380 + uVar12) + (short)iVar14 * (short)DVar3;
        iVar8 = iVar8 + 1;
        uVar12 = uVar12 + 2;
      } while ((uint)(iVar11 * 2) != uVar12);
      iVar14 = iVar14 + 1;
      iVar8 = this->m_primitiveCount;
      local_cc = local_cc + DVar3 * 4;
      iVar9 = iVar9 + iVar6;
    } while (iVar14 < iVar8);
  }
  gl = local_58;
  p_Var5 = local_58->uniform4fv;
  GVar7 = (*local_58->getUniformLocation)(program,"u_color");
  (*p_Var5)(GVar7,1,(GLfloat *)&local_40);
  if ((ulong)this->m_primitiveType < 3) {
    drawPrimitives(gl,program,*(deUint32 *)(&DAT_01cef404 + (ulong)this->m_primitiveType * 4),
                   &local_70,&local_88);
  }
  if (local_88.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_88.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_88.
                          super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_88.
                          super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  if (local_70.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_70.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_70.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_70.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void ScissorPrimitiveCase::render (GLuint program, const IVec4&) const
{
	const glw::Functions&		gl				= m_renderCtx.getFunctions();
	const Vec4					white			(1.0f, 1.0f, 1.0f, 1.0);
	const Vec4					primitiveArea	(m_renderArea.x()*2.0f-1.0f,
												 m_renderArea.x()*2.0f-1.0f,
												 m_renderArea.z()*2.0f,
												 m_renderArea.w()*2.0f);

	static const float quadPositions[] =
	{
		 0.0f,  1.0f,
		 0.0f,  0.0f,
		 1.0f,  1.0f,
		 1.0f,  0.0f
	};
	static const float triPositions[] =
	{
		 0.0f,  0.0f,
		 1.0f,  0.0f,
		 0.5f,  1.0f,
	};
	static const float linePositions[] =
	{
		 0.0f,  0.0f,
		 1.0f,  1.0f
	};
	static const float pointPosition[] =
	{
		 0.5f,  0.5f
	};

	const float*		positionSet[]	= { pointPosition, linePositions, triPositions, quadPositions };
	const int			vertexCountSet[]= { 1, 2, 3, 4 };
	const int			indexCountSet[]	= { 1, 2, 3, 6 };

	const deUint16		baseIndices[]	= { 0, 1, 2, 2, 1, 3 };
	const float*		basePositions	= positionSet[m_primitiveType];
	const int			vertexCount		= vertexCountSet[m_primitiveType];
	const int			indexCount		= indexCountSet[m_primitiveType];

	const float			scale			= 1.44f/deFloatSqrt(float(m_primitiveCount)*2.0f); // Magic value to roughly fill the render area with primitives at a readable density
	vector<float>		positions		(4*vertexCount*m_primitiveCount);
	vector<deUint16>	indices			(indexCount*m_primitiveCount);
	de::Random			rng				(1234);

	for (int primNdx = 0; primNdx < m_primitiveCount; primNdx++)
	{
		const float dx = m_primitiveCount>1 ? rng.getFloat() : 0.0f;
		const float dy = m_primitiveCount>1 ? rng.getFloat() : 0.0f;

		for (int vertNdx = 0; vertNdx < vertexCount; vertNdx++)
		{
			const int ndx = primNdx*4*vertexCount + vertNdx*4;
			positions[ndx+0] = (basePositions[vertNdx*2 + 0]*scale + dx)*primitiveArea.z() + primitiveArea.x();
			positions[ndx+1] = (basePositions[vertNdx*2 + 1]*scale + dy)*primitiveArea.w() + primitiveArea.y();
			positions[ndx+2] = 0.2f;
			positions[ndx+3] = 1.0f;
		}

		for (int ndx = 0; ndx < indexCount; ndx++)
			indices[primNdx*indexCount + ndx] = (deUint16)(baseIndices[ndx] + primNdx*vertexCount);
	}

	gl.uniform4fv(gl.getUniformLocation(program, "u_color"), 1, white.m_data);

	switch (m_primitiveType)
	{
		case TRIANGLE:	drawPrimitives(gl, program, GL_TRIANGLES,	positions, indices);	break;
		case LINE:		drawPrimitives(gl, program, GL_LINES,		positions, indices);	break;
		case POINT:		drawPrimitives(gl, program, GL_POINTS,		positions, indices);	break;
		default:		DE_ASSERT(false);													break;
	}
}